

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::AllocatePage(PF_BufferMgr *this,int fd,PageNum pageNum,char **ppBuffer)

{
  PF_BufPageDesc *pPVar1;
  RC RVar2;
  RC RVar3;
  undefined8 in_RAX;
  long lVar4;
  int slot;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  RVar2 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&local_34);
  if (RVar2 == -8) {
    RVar3 = InternalAlloc(this,&local_34);
    if (RVar3 == 0) {
      RVar3 = PF_HashTable::Insert(&this->hashTable,fd,pageNum,local_34);
      lVar4 = (long)local_34;
      if (RVar3 == 0) {
        pPVar1 = this->bufTable;
        pPVar1[lVar4].fd = fd;
        pPVar1[lVar4].pageNum = pageNum;
        pPVar1[lVar4].bDirty = 0;
        pPVar1[lVar4].pinCount = 1;
        *ppBuffer = pPVar1[local_34].pData;
        RVar3 = 0;
      }
      else {
        Unlink(this,local_34);
        this->bufTable[local_34].next = this->free;
        this->free = local_34;
      }
    }
  }
  else {
    RVar3 = -7;
    if (RVar2 != 0) {
      RVar3 = RVar2;
    }
  }
  return RVar3;
}

Assistant:

RC PF_BufferMgr::AllocatePage(int fd, PageNum pageNum, char **ppBuffer)
{
   RC  rc;     // return code
   int slot;   // buffer slot where page is located

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Allocating a page for (%d,%d)....", fd, pageNum);
   WriteLog(psMessage);
#endif

   // If page is already in buffer, return an error
   if (!(rc = hashTable.Find(fd, pageNum, slot)))
      return (PF_PAGEINBUF);
   else if (rc != PF_HASHNOTFOUND)
      return (rc);              // unexpected error

   // Allocate an empty page
   if ((rc = InternalAlloc(slot)))
      return (rc);

   // Insert the page into the hash table,
   // and initialize the page description entry
   if ((rc = hashTable.Insert(fd, pageNum, slot)) ||
         (rc = InitPageDesc(fd, pageNum, slot))) {

      // Put the slot back on the free list before returning the error
      Unlink(slot);
      InsertFree(slot);
      return (rc);
   }

#ifdef PF_LOG
   WriteLog("Succesfully allocated page.\n");
#endif

   // Point ppBuffer to page
   *ppBuffer = bufTable[slot].pData;

   // Return ok
   return (0);
}